

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_0::AsyncStreamFd::tryPumpFrom
          (AsyncStreamFd *this,AsyncInputStream *input,uint64_t amount)

{
  long lVar1;
  bool bVar2;
  SourceLocation location;
  AsyncStreamFd *input_00;
  AsyncOutputStream AVar3;
  undefined8 uVar4;
  int osErrorNumber;
  uint osErrorNumber_00;
  Exception *readSoFar;
  ssize_t sVar5;
  Disposer *pDVar6;
  void *pvVar7;
  Disposer *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar8;
  FileInputStream *file;
  Disposer *__n;
  size_t __nbytes;
  AsyncStreamFd *this_00;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:352:31)>
  *location_00;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:354:31)>
  *location_01;
  Disposer *pDVar9;
  Maybe<kj::Promise<unsigned_long>_> MVar10;
  Promise<void> promise;
  OwnPromiseNode intermediate;
  Fault f;
  anon_class_8_1_ba1d6db4_for_func local_10a0;
  void *continuationTracePtr_1;
  Disposer *local_1090;
  AsyncStreamFd *local_1088;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1080;
  PromiseFulfiller<void> *pPStack_1078;
  Disposer *local_1070;
  AsyncStreamFd *local_1068;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1060;
  AsyncOutputStream local_1058;
  Array<unsigned_char> leftover;
  byte buffer [4096];
  
  readSoFar = (Exception *)
              __dynamic_cast(amount,&AsyncInputStream::typeinfo,
                             &(anonymous_namespace)::AsyncStreamFd::typeinfo,0);
  if (readSoFar == (Exception *)0x0) {
    dynamicDowncastIfAvailable<kj::FileInputStream,kj::AsyncInputStream>
              ((kj *)buffer,(AsyncInputStream *)amount);
    uVar4 = buffer._0_8_;
    aVar8 = extraout_RDX;
    if (buffer._0_8_ != 0) {
      (**(code **)**(undefined8 **)(buffer._0_8_ + 8))(buffer);
      aVar8 = extraout_RDX_00;
      if (buffer[0] == '\x01') {
        this_00 = (AsyncStreamFd *)buffer;
        pumpFromFile(this_00,(FileInputStream *)input,(int)uVar4,(ulong)buffer._0_8_ >> 0x20,
                     (uint64_t)in_RCX);
        *(undefined1 *)
         &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = 1;
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
        _vptr_AsyncOutputStream = (_func_int **)buffer._0_8_;
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        goto LAB_0038c1c0;
      }
    }
    *(undefined1 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 0;
  }
  else {
    local_1088 = this;
    local_1068 = (AsyncStreamFd *)input;
    memset(buffer,0,0x1000);
    pDVar6 = (Disposer *)0x0;
    local_1090 = in_RCX;
    pDVar9 = (Disposer *)0x1000;
    if (in_RCX < (Disposer *)0x1000) {
      pDVar9 = in_RCX;
    }
    do {
      __n = pDVar6;
      __nbytes = (long)pDVar9 - (long)__n;
      bVar2 = pDVar9 >= __n && __nbytes != 0;
      if (pDVar9 < __n || __nbytes == 0) {
LAB_0038bf80:
        bVar2 = false;
        break;
      }
      while (sVar5 = read(*(int *)&(readSoFar->ownFile).content.disposer,buffer + (long)__n,__nbytes
                         ), sVar5 < 0) {
        osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
        if (osErrorNumber != -1) {
          if (osErrorNumber != 0) {
            kj::_::Debug::Fault::Fault
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                       ,0x14c,osErrorNumber,
                       "n = ::read(input.fd, buffer + pos, initialAmount - pos)","");
            kj::_::Debug::Fault::fatal(&f);
          }
          goto LAB_0038bf80;
        }
      }
      pDVar6 = (Disposer *)((long)&__n->_vptr_Disposer + sVar5);
    } while (sVar5 != 0);
    input_00 = local_1068;
    do {
      pDVar6 = (Disposer *)::write((input_00->super_OwnedFileDescriptor).fd,buffer,(size_t)__n);
      if (-1 < (long)pDVar6) goto LAB_0038c07a;
      osErrorNumber_00 = kj::_::Debug::getOsErrorNumber(true);
    } while (osErrorNumber_00 == 0xffffffff);
    pDVar6 = (Disposer *)(ulong)osErrorNumber_00;
    if (osErrorNumber_00 != 0) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x157,osErrorNumber_00,"n = ::write(fd, buffer, pos)","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_0038c07a:
    this = local_1088;
    if (pDVar6 <= __n && (long)__n - (long)pDVar6 != 0) {
      heapArray<unsigned_char>(&leftover,buffer + (long)pDVar6,(long)__n - (long)pDVar6);
      (*(input_00->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream[0x14])(&promise,input_00,leftover.ptr,leftover.size_);
      Promise<void>::attach<kj::Array<unsigned_char>>
                ((Promise<void> *)&f,(Array<unsigned_char> *)&promise);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
      if ((bool)(__n != local_1090 & (bVar2 ^ 1U))) {
        continuationTracePtr_1 =
             kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:354:31)>
             ::anon_class_32_4_8eb467c7_for_func::operator();
        lVar1 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
        f.exception = readSoFar;
        if (lVar1 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar1) < 0x40) {
          pvVar7 = operator_new(0x400);
          location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:354:31)>
                         *)((long)pvVar7 + 0x3c0);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromOther(kj::(anonymous_namespace)::AsyncStreamFd&,unsigned_long)::_lambda()_4_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromOther(kj::(anonymous_namespace)::AsyncStreamFd&,unsigned_long)::_lambda()_4_,void*&>
                    (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
                     (anon_class_32_4_8eb467c7_for_func *)&f,&continuationTracePtr_1);
          *(void **)((long)pvVar7 + 0x3c8) = pvVar7;
        }
        else {
          *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
          location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:354:31)>
                         *)((long)promise.super_PromiseBase.node.ptr + -0x40);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromOther(kj::(anonymous_namespace)::AsyncStreamFd&,unsigned_long)::_lambda()_4_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromOther(kj::(anonymous_namespace)::AsyncStreamFd&,unsigned_long)::_lambda()_4_,void*&>
                    (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
                     (anon_class_32_4_8eb467c7_for_func *)&f,&continuationTracePtr_1);
          *(long *)((long)promise.super_PromiseBase.node.ptr + -0x38) = lVar1;
        }
        local_1080.ptr = (PromiseNode *)&DAT_003d3151;
        pPStack_1078 = (PromiseFulfiller<void> *)&DAT_003d31b0;
        local_1070 = (Disposer *)0x4c0000058b;
        location.function = &DAT_003d31b0;
        location.fileName = &DAT_003d3151;
        location.lineNumber = 0x58b;
        location.columnNumber = 0x4c;
        intermediate.ptr = (PromiseNode *)location_01;
        kj::_::maybeChain<unsigned_long>
                  ((OwnPromiseNode *)&local_1058,(Promise<unsigned_long> *)&intermediate,location);
        AVar3._vptr_AsyncOutputStream = local_1058._vptr_AsyncOutputStream;
        local_1058._vptr_AsyncOutputStream = (_func_int **)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1058);
        local_1060.ptr = (PromiseNode *)AVar3._vptr_AsyncOutputStream;
        local_10a0.pos = 0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_10a0);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
        *(undefined1 *)
         &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = 1;
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
        _vptr_AsyncOutputStream = AVar3._vptr_AsyncOutputStream;
        local_1060.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1060);
      }
      else {
        f.exception = (Exception *)
                      kj::_::
                      SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:352:31)>
                      ::anon_class_8_1_ba1d6db4_for_func::operator();
        lVar1 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
        local_10a0.pos = (size_t)__n;
        if (lVar1 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar1) < 0x28) {
          pvVar7 = operator_new(0x400);
          location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:352:31)>
                         *)((long)pvVar7 + 0x3d8);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromOther(kj::(anonymous_namespace)::AsyncStreamFd&,unsigned_long)::_lambda()_3_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromOther(kj::(anonymous_namespace)::AsyncStreamFd&,unsigned_long)::_lambda()_3_,void*&>
                    (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
                     &local_10a0,&f.exception);
          *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
        }
        else {
          *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
          location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:352:31)>
                         *)((long)promise.super_PromiseBase.node.ptr + -0x28);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromOther(kj::(anonymous_namespace)::AsyncStreamFd&,unsigned_long)::_lambda()_3_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromOther(kj::(anonymous_namespace)::AsyncStreamFd&,unsigned_long)::_lambda()_3_,void*&>
                    (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
                     &local_10a0,&f.exception);
          *(long *)((long)promise.super_PromiseBase.node.ptr + -0x20) = lVar1;
        }
        local_1080.ptr = (PromiseNode *)0x0;
        continuationTracePtr_1 = (void *)0x0;
        intermediate.ptr = (PromiseNode *)location_00;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr_1);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1080);
        *(undefined1 *)
         &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = 1;
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
        _vptr_AsyncOutputStream = (_func_int **)location_00;
        intermediate.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
      }
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
      Array<unsigned_char>::~Array(&leftover);
      aVar8 = extraout_RDX_02;
      goto LAB_0038c389;
    }
    this_00 = (AsyncStreamFd *)&f;
    if ((bool)(__n != local_1090 & (bVar2 ^ 1U))) {
      splicePumpFrom(this_00,input_00,(uint64_t)readSoFar,(uint64_t)__n);
    }
    else {
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this_00,(FixVoid<unsigned_long>)__n)
      ;
    }
    *(undefined1 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 1;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = (_func_int **)f.exception;
    f.exception = (Exception *)0x0;
LAB_0038c1c0:
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_00);
    aVar8 = extraout_RDX_01;
  }
LAB_0038c389:
  MVar10.ptr.field_1 = aVar8;
  MVar10.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar10.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(
      AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
#if __linux__ && !__ANDROID__
    KJ_IF_SOME(sock, kj::dynamicDowncastIfAvailable<AsyncStreamFd>(input)) {
      return pumpFromOther(sock, amount);
    }
#endif

#if __linux__
    KJ_IF_SOME(file, kj::dynamicDowncastIfAvailable<FileInputStream>(input)) {
      KJ_IF_SOME(fd, file.getUnderlyingFile().getFd()) {
        return pumpFromFile(file, fd, amount, 0);
      }
    }
#endif

    return kj::none;
  }